

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O1

void __thiscall Game::load_maze(Game *this)

{
  pointer *pppAVar1;
  int *piVar2;
  pointer *ppGVar3;
  uint *puVar4;
  iterator __position;
  Direction DVar5;
  char cVar6;
  istream *this_00;
  undefined8 extraout_RAX;
  long lVar7;
  Position PVar8;
  Ghost_State *pGVar9;
  iterator __position_00;
  SeenMatrix *this_01;
  int iVar10;
  size_type __n;
  Position PVar11;
  int iVar12;
  long lVar13;
  State *s;
  byte bVar14;
  char cell;
  int cols;
  int rows;
  __hashtable *__h_1;
  __hashtable *__h;
  char dummy;
  ifstream maze_file;
  uint local_304;
  uint local_300;
  uint local_2fc;
  allocator_type local_2f6;
  allocator_type local_2f5;
  int local_2f4;
  long local_2f0;
  undefined1 local_2e8 [16];
  Direction local_2d8;
  float local_2d0;
  Position local_2cc;
  bool local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  undefined8 local_2b4;
  undefined8 uStack_2ac;
  Position local_298;
  undefined1 local_290 [32];
  State *local_270;
  vector<Ghost_State,_std::allocator<Ghost_State>_> *local_268;
  Game *local_260;
  Position local_258;
  vector<int,_std::allocator<int>_> local_250;
  long local_238 [3];
  uint auStack_220 [124];
  
  bVar14 = 0;
  this->loaded_maze = true;
  std::ifstream::ifstream((string *)local_238);
  std::ifstream::open((string *)local_238,0x1214d8);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   "Invalid maze file path \'",&Arguments::maze_path_abi_cxx11_);
    std::__cxx11::string::append(local_290);
    load_maze();
    if ((pointer)local_290._0_8_ != (pointer)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_);
    }
    std::ifstream::~ifstream(local_238);
    _Unwind_Resume(extraout_RAX);
  }
  this_00 = (istream *)std::istream::operator>>((istream *)local_238,(int *)&local_2fc);
  std::istream::operator>>(this_00,(int *)&local_300);
  Matrix<char>::Matrix((Matrix<char> *)local_2e8,local_2fc,local_300,'\0');
  s = &this->state;
  Matrix<char>::operator=(&s->maze,(Matrix<char> *)local_2e8);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *)(local_2e8 + 8));
  __n = (size_type)(int)local_2fc;
  local_304 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_250,(long)(int)local_300,(value_type_conflict1 *)&local_304,&local_2f5);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_290,__n,&local_250,&local_2f6);
  local_2d8 = (Direction)
              PathMagic::index_from_pos.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8._8_8_ =
       PathMagic::index_from_pos.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._0_8_ =
       PathMagic::index_from_pos.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  PathMagic::index_from_pos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_290._0_8_;
  PathMagic::index_from_pos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_290._8_8_;
  PathMagic::index_from_pos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_290._16_8_;
  local_290._0_8_ = (pointer)0x0;
  local_290._8_8_ = (pointer)0x0;
  local_290._16_8_ = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_2e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_290);
  if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
      super__Vector_impl_data._M_start) {
    State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
    super__Vector_impl_data._M_finish =
         State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
    super__Vector_impl_data._M_finish =
         State::valid_positions_no_spawn.super__Vector_base<Position,_std::allocator<Position>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  puVar4 = (uint *)((long)auStack_220 + *(long *)(local_238[0] + -0x18));
  *puVar4 = *puVar4 & 0xffffefff;
  this_01 = (SeenMatrix *)(ulong)local_2fc;
  if (0 < (int)local_2fc) {
    local_298 = (Position)&(this->state).pills;
    local_258 = (Position)&(this->state).powerpills;
    local_268 = &(this->state).ghosts;
    PVar11.i = 0;
    PVar11.j = 0;
    local_2f4 = 0;
    local_270 = s;
    local_260 = this;
    do {
      std::operator>>((istream *)local_238,(char *)&local_250);
      if (0 < (int)local_300) {
        local_2f0 = (long)PVar11 * 3;
        lVar13 = 0;
        PVar8 = PVar11;
        do {
          std::operator>>((istream *)local_238,(char *)&local_304);
          cVar6 = (char)local_304;
          if ((char)local_304 == 'G') {
            cVar6 = ' ';
          }
          if ((char)local_304 == 'P') {
            cVar6 = ' ';
          }
          *(char *)(*(long *)((long)&(((this->state).maze.t.
                                       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                             local_2f0 * 8) + lVar13) = cVar6;
          piVar2 = &(this->state).n_normal_pills_left;
          *piVar2 = *piVar2 + (uint)((local_304 & 0xff) == 0x2e);
          piVar2 = &(this->state).n_powerpills_left;
          *piVar2 = *piVar2 + (uint)((local_304 & 0xff) == 0x6f);
          if ((local_304 & 0xff) == 0x2e) {
            local_290._0_4_ =
                 (int)((ulong)((long)State::valid_positions.
                                     super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)State::valid_positions.
                                    super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
            local_2e8._0_4_ = local_298.i;
            local_2e8._4_4_ = local_298.j;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_298,local_290,(Ghost_State *)local_2e8);
          }
          else if ((local_304 & 0xff) == 0x6f) {
            local_290._0_4_ =
                 (undefined4)
                 ((ulong)((long)State::valid_positions.
                                super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)State::valid_positions.
                               super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
            local_2e8._0_4_ = local_258.i;
            local_2e8._4_4_ = local_258.j;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_258,local_290,(Ghost_State *)local_2e8);
            local_290._0_4_ =
                 (int)((ulong)((long)State::valid_positions.
                                     super__Vector_base<Position,_std::allocator<Position>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)State::valid_positions.
                                    super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
            local_2e8._0_4_ = local_298.i;
            local_2e8._4_4_ = local_298.j;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_298,local_290,(Ghost_State *)local_2e8);
            this = local_260;
          }
          iVar10 = PVar11.i;
          iVar12 = (int)lVar13;
          if ((char)local_304 != '%') {
            local_2e8._4_4_ = iVar12;
            local_2e8._0_4_ = iVar10;
            if (State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Position,_std::allocator<Position>_>::_M_realloc_insert<Position>
                        (&State::valid_positions,
                         (iterator)
                         State::valid_positions.
                         super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Position *)local_2e8);
            }
            else {
              *State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>.
               _M_impl.super__Vector_impl_data._M_finish = (Position)local_2e8._0_8_;
              State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   State::valid_positions.super__Vector_base<Position,_std::allocator<Position>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            if (((local_304 & 0xff) != 0x47) && ((local_304 & 0xff) != 0x58)) {
              if (State::valid_positions_no_spawn.
                  super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  State::valid_positions_no_spawn.
                  super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Position,_std::allocator<Position>_>::_M_realloc_insert<Position>
                          (&State::valid_positions_no_spawn,
                           (iterator)
                           State::valid_positions_no_spawn.
                           super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Position *)local_2e8);
              }
              else {
                *State::valid_positions_no_spawn.
                 super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                 super__Vector_impl_data._M_finish = (Position)local_2e8._0_8_;
                State::valid_positions_no_spawn.
                super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     State::valid_positions_no_spawn.
                     super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            (&((PathMagic::index_from_pos.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start)[local_2f0][lVar13] = local_2f4;
            local_2f4 = local_2f4 + 1;
          }
          DVar5 = Direction::UP;
          if ((local_304 & 0xff) == 0x47) {
            *(undefined1 *)
             (*(long *)((long)&(((this->state).maze.t.
                                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl +
                       local_2f0 * 8) + lVar13) = 0x58;
            local_2e8._0_4_ = PVar8.i;
            local_2e8._4_4_ = PVar8.j;
            local_2e8._8_4_ = -1;
            local_2e8._12_4_ = -1;
            local_2d8 = Direction::UP;
            local_2d0 = 0.0;
            local_2cc = PVar8;
            local_2c4 = false;
            local_2c0 = 0;
            local_2bc = Arguments::initial_scatter_cycle_rounds;
            local_2b8 = Arguments::initial_chase_cycle_rounds;
            local_2b4._0_4_ = CHASE;
            local_2b4._4_4_ = -1;
            uStack_2ac._0_4_ = -1;
            uStack_2ac._4_4_ = 0;
            __position_00._M_current =
                 (this->state).ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->state).ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Ghost_State,_std::allocator<Ghost_State>_>::_M_realloc_insert<Ghost_State>
                        (local_268,__position_00,(Ghost_State *)local_2e8);
            }
            else {
              pGVar9 = (Ghost_State *)local_2e8;
              for (lVar7 = 0x11; lVar7 != 0; lVar7 = lVar7 + -1) {
                ((__position_00._M_current)->super_Agent_State).pos.i =
                     (pGVar9->super_Agent_State).pos.i;
                pGVar9 = (Ghost_State *)((long)pGVar9 + (ulong)bVar14 * -8 + 4);
                __position_00._M_current = __position_00._M_current + (ulong)bVar14 * -8 + 4;
              }
              ppGVar3 = &(this->state).ghosts.
                         super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppGVar3 = *ppGVar3 + 1;
            }
            local_2e8._0_8_ = operator_new(8);
            *(undefined ***)local_2e8._0_8_ = &PTR_take_action_00120b08;
            __position._M_current =
                 (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Agent*,std::allocator<Agent*>>::_M_realloc_insert<Agent*>
                        ((vector<Agent*,std::allocator<Agent*>> *)this,__position,
                         (Agent **)local_2e8);
            }
            else {
              *__position._M_current = (Agent *)local_2e8._0_8_;
              pppAVar1 = &(this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppAVar1 = *pppAVar1 + 1;
            }
          }
          else if ((local_304 & 0xff) == 0x50) {
            (this->state).pacman.pos.i = iVar10;
            (this->state).pacman.pos.j = iVar12;
            (this->state).pacman.prev.i = -1;
            (this->state).pacman.prev.j = -1;
            (this->state).pacman.dir.i = DVar5.i;
            (this->state).pacman.dir.j = DVar5.j;
            (this->state).pacman.step = 0.0;
          }
          lVar13 = lVar13 + 1;
          PVar8 = (Position)((long)PVar8 + 0x100000000);
        } while (lVar13 < (int)local_300);
      }
      PVar11 = (Position)((long)PVar11 + 1);
      this_01 = (SeenMatrix *)(long)(int)local_2fc;
      s = local_270;
    } while ((long)PVar11 < (long)this_01);
  }
  State::total_normal_pills = (this->state).n_normal_pills_left;
  State::total_powerpills = (this->state).n_powerpills_left;
  State::total_pills = State::total_powerpills + State::total_normal_pills;
  State::distribution_valid_pos_no_spawn._M_param =
       (param_type)
       (((long)State::valid_positions_no_spawn.
               super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)State::valid_positions_no_spawn.
              super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
              super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000);
  State::n_ghosts =
       (int)((ulong)((long)(this->state).ghosts.
                           super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) * -0xf0f0f0f;
  SeenMatrix::init(this_01,(EVP_PKEY_CTX *)(ulong)local_300);
  PathMagic::compute_valid_dirs_intersections(s);
  PathMagic::compute_paths(s);
  PathMagic::compute_enclosing_intersections(s);
  RL_Pacman_Agent_Inputs::precompute();
  Matrix<char>::operator=(&(this->initialState).maze,&s->maze);
  iVar10 = (this->state).n_powerpills_left;
  (this->initialState).n_normal_pills_left = (this->state).n_normal_pills_left;
  (this->initialState).n_powerpills_left = iVar10;
  std::vector<Ghost_State,_std::allocator<Ghost_State>_>::operator=
            (&(this->initialState).ghosts,&(this->state).ghosts);
  iVar10 = (this->state).round;
  iVar12 = (this->state).n_rounds_powerpill;
  (this->initialState).pacman.pos = (this->state).pacman.pos;
  DVar5 = (this->state).pacman.dir;
  (this->initialState).pacman.prev = (this->state).pacman.prev;
  (this->initialState).pacman.dir = DVar5;
  (this->initialState).pacman.step = (this->state).pacman.step;
  (this->initialState).round = iVar10;
  (this->initialState).n_rounds_powerpill = iVar12;
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&(this->initialState).pills,&(this->state).pills._M_h);
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&(this->initialState).powerpills,&(this->state).powerpills._M_h);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void load_maze() {
        loaded_maze = true;

        ifstream maze_file;
        maze_file.open(Arguments::maze_path);

        if (not maze_file.is_open())
            error("Invalid maze file path '" + Arguments::maze_path + "'");

        int rows, cols;
        maze_file >> rows >> cols;
        state.maze = Matrix<char>(rows, cols);
        uint valid_index = 0;
        PathMagic::index_from_pos = vector<vector<int>>(rows, vector<int>(cols, -1));
        State::valid_positions.clear();
        State::valid_positions_no_spawn.clear();

        maze_file >> std::noskipws;
        for (int i = 0; i < rows; ++i) {
            char dummy; maze_file >> dummy;
            for (int j = 0; j < cols; ++j) {
                char cell; maze_file >> cell;
                state.maze[i][j] = cell != State::PACMAN and cell != State::GHOST ? cell : State::FREE;

                state.n_normal_pills_left += cell == State::PILL;
                state.n_powerpills_left += cell == State::POWER_PILL;

                if (cell == State::POWER_PILL) {
                    state.powerpills.insert(state.valid_positions.size());
                    state.pills.insert(state.valid_positions.size());
                }
                else if (cell == State::PILL) {
                    state.pills.insert(state.valid_positions.size());
                }

                if (cell != State::WALL) {
                    state.valid_positions.push_back(Position(i, j));
                    if (cell != State::SPAWN_AREA and cell != State::GHOST) state.valid_positions_no_spawn.push_back(Position(i, j));
                    PathMagic::index_from_pos[i][j] = valid_index++;
                }

                if (cell == State::PACMAN) state.pacman = Agent_State(Position(i, j), Direction::UP);
                else if (cell == State::GHOST) {
                    state.maze[i][j] = State::SPAWN_AREA;
                    state.ghosts.push_back(Ghost_State(Position(i, j), Direction::UP));
                    ghosts.push_back((Agent*)new Ghost_Agent());
                }
            }
        }

        state.total_pills = state.n_normal_pills_left + state.n_powerpills_left;
        state.total_powerpills = state.n_powerpills_left;
        state.total_normal_pills = state.n_normal_pills_left;
        state.distribution_valid_pos_no_spawn = uniform_int_distribution<>(0, state.valid_positions_no_spawn.size() - 1);
        state.n_ghosts = state.ghosts.size();

        SeenMatrix::init(rows, cols);
        PathMagic::compute(state);
        RL_Pacman_Agent_Inputs::precompute();

        initialState = state;
    }